

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error ft_stroker_arcto(PVG_FT_Stroker stroker,PVG_FT_Int side)

{
  PVG_FT_Angle PVar1;
  long lVar2;
  PVG_FT_Fixed PVar3;
  PVG_FT_Long PVar4;
  PVG_FT_Long PVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  PVG_FT_Vector a2;
  PVG_FT_Vector a1;
  PVG_FT_Vector a0;
  PVG_FT_Vector local_a8;
  PVG_FT_StrokeBorder local_98;
  PVG_FT_Fixed local_90;
  PVG_FT_Vector local_88;
  PVG_FT_Vector local_78;
  long local_68;
  ulong local_60;
  long local_58;
  long local_50;
  PVG_FT_Stroker local_48;
  PVG_FT_Vector local_40;
  
  local_90 = stroker->radius;
  uVar7 = (ulong)(uint)side;
  PVar1 = PVG_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  lVar9 = uVar7 * 0x1680000 + -0xb40000;
  if (PVar1 != 0xb40000) {
    lVar9 = PVar1;
  }
  local_98 = stroker->borders + uVar7;
  lVar2 = -lVar9;
  if (0 < lVar9) {
    lVar2 = lVar9;
  }
  if (lVar2 < 0x5a0001) {
    lVar2 = 0x5a0000;
  }
  lVar6 = uVar7 * -0xb40000 + stroker->angle_in + 0x5a0000;
  uVar7 = (lVar2 - 1U) / 0x5a0000 + 1;
  PVar3 = PVG_FT_Tan(lVar9 / (long)(ulong)(uint)((int)uVar7 * 4));
  lVar2 = PVar3 / 3 + PVar3;
  local_58 = lVar6;
  PVG_FT_Vector_From_Polar(&local_40,local_90,lVar6);
  PVar4 = PVG_FT_MulFix(-local_40.y,lVar2);
  local_78.x = PVar4;
  local_68 = lVar2;
  PVar5 = PVG_FT_MulFix(local_40.x,lVar2);
  local_40.x = local_40.x + (stroker->center).x;
  local_40.y = local_40.y + (stroker->center).y;
  local_78.x = local_40.x + PVar4;
  local_78.y = local_40.y + PVar5;
  lVar2 = (uVar7 & 0xffffffff) + (ulong)((uVar7 & 0xffffffff) == 0);
  local_60 = uVar7;
  local_50 = lVar9;
  local_48 = stroker;
  do {
    PVG_FT_Vector_From_Polar(&local_a8,local_90,lVar9 / (long)local_60 + local_58);
    lVar6 = local_68;
    PVar4 = PVG_FT_MulFix(local_a8.y,local_68);
    local_88.x = PVar4;
    PVar5 = PVG_FT_MulFix(-local_a8.x,lVar6);
    local_a8.x = local_a8.x + (local_48->center).x;
    local_a8.y = local_a8.y + (local_48->center).y;
    lVar8 = local_a8.x + PVar4;
    lVar6 = local_a8.y + PVar5;
    local_88.x = lVar8;
    local_88.y = lVar6;
    ft_stroke_border_cubicto(local_98,&local_78,&local_88,&local_a8);
    local_78.x = local_a8.x * 2 - lVar8;
    local_78.y = local_a8.y * 2 - lVar6;
    lVar9 = lVar9 + local_50;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  local_98->movable = '\0';
  return (PVG_FT_Error)local_98;
}

Assistant:

static PVG_FT_Error ft_stroker_arcto(PVG_FT_Stroker stroker, PVG_FT_Int side)
{
    PVG_FT_Angle        total, rotate;
    PVG_FT_Fixed        radius = stroker->radius;
    PVG_FT_Error        error = 0;
    PVG_FT_StrokeBorder border = stroker->borders + side;

    rotate = PVG_FT_SIDE_TO_ROTATE(side);

    total = PVG_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);
    if (total == PVG_FT_ANGLE_PI) total = -rotate * 2;

    error = ft_stroke_border_arcto(border, &stroker->center, radius,
                                   stroker->angle_in + rotate, total);
    border->movable = FALSE;
    return error;
}